

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.cxx
# Opt level: O1

int __thiscall ncursespp::draw::text(draw *this,string *text,rect_i r,color_index color)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  rect_i r_00;
  
  r_00.right_bottom.y = 0;
  uVar1 = SUB128(r._0_12_,0);
  r_00.left_top.x = (int)uVar1;
  r_00.left_top.y = (int)((ulong)uVar1 >> 0x20);
  r_00.right_bottom.x = SUB124(r._0_12_,8);
  fill_rect((draw *)text,r_00,(color_index)r.right_bottom.x);
  iVar6 = (r.right_bottom.x & 0xffU) << 8;
  iVar2 = 0;
  wattr_on(_stdscr,iVar6,0);
  iVar7 = (int)text;
  uVar3 = r.left_top.x - iVar7;
  if (uVar3 != 0 && iVar7 <= r.left_top.x) {
    uVar4 = 0;
    do {
      uVar5 = uVar4;
      if (*(ulong *)(this + 8) <= uVar4) break;
      iVar2 = wmove(_stdscr,(ulong)text >> 0x20,iVar7 + (int)uVar4);
      if (iVar2 != -1) {
        waddch(_stdscr,(int)*(char *)(*(long *)this + uVar4));
      }
      uVar4 = uVar4 + 1;
      uVar5 = (ulong)uVar3;
    } while (uVar3 != (uint)uVar4);
    iVar2 = (int)uVar5;
  }
  wattr_off(_stdscr,iVar6,0);
  return iVar2;
}

Assistant:

int draw::text(const std::string &text, rect_i r, color_index color)
{
    auto lt = r.left_top;
    int res = 0;
    fill_rect(r, color); // TODO: optimize!

    attron(COLOR_PAIR(color.index));
    for (auto i = 0u;
         static_cast<int>(i) < r.width() && i < text.size();
         ++i) {
        mvaddch(lt.y, lt.x + i, text[i]);
        res ++;
    }
    attroff(COLOR_PAIR(color.index));
    return res;
}